

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

ecs_query_t * ecs_subquery_new(ecs_world_t *world,ecs_query_t *parent,char *expr)

{
  ecs_query_t *subquery;
  ecs_query_t *result;
  ecs_sig_t sig;
  char *expr_local;
  ecs_query_t *parent_local;
  ecs_world_t *world_local;
  
  sig.columns = (ecs_vector_t *)expr;
  memset(&result,0,0x18);
  ecs_sig_init(world,(char *)0x0,(char *)sig.columns,(ecs_sig_t *)&result);
  subquery = ecs_query_new_w_sig_intern(world,0,(ecs_sig_t *)&result,true);
  subquery->parent = parent;
  add_subquery(world,parent,subquery);
  return subquery;
}

Assistant:

ecs_query_t* ecs_subquery_new(
    ecs_world_t *world,
    ecs_query_t *parent,
    const char *expr)
{
    ecs_sig_t sig = { 0 };
    ecs_sig_init(world, NULL, expr, &sig);
    ecs_query_t *result = ecs_query_new_w_sig_intern(world, 0, &sig, true);
    result->parent = parent;
    add_subquery(world, parent, result);
    return result;
}